

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectCreation.h
# Opt level: O0

Expression * CreateObject(PrimitiveSimpleObject *object)

{
  int value;
  ExpressionList *this;
  ConstExpression *this_00;
  EseqExpression *this_01;
  MoveStatement *this_02;
  TempExpression *pTVar1;
  CallExpression *this_03;
  NameExpression *this_04;
  Temporary local_d8;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  allocator<char> local_b1;
  string local_b0;
  Label local_90;
  undefined1 local_69;
  Temporary local_68;
  undefined1 local_48 [8];
  Temporary tmp;
  ExpressionList *irt_expressions;
  PrimitiveSimpleObject *object_local;
  
  this = (ExpressionList *)operator_new(0x20);
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  IRT::ExpressionList::ExpressionList(this);
  this_00 = (ConstExpression *)operator_new(0x10);
  value = (*(object->super_PrimitiveObject).super_Object._vptr_Object[3])();
  IRT::ConstExpression::ConstExpression(this_00,value);
  IRT::ExpressionList::Add(this,(Expression *)this_00);
  IRT::Temporary::Temporary((Temporary *)local_48);
  this_01 = (EseqExpression *)operator_new(0x18);
  this_02 = (MoveStatement *)operator_new(0x18);
  local_b4 = 1;
  pTVar1 = (TempExpression *)operator_new(0x28);
  local_69 = 1;
  IRT::Temporary::Temporary(&local_68,(Temporary *)local_48);
  IRT::TempExpression::TempExpression(pTVar1,&local_68);
  local_69 = 0;
  this_03 = (CallExpression *)operator_new(0x18);
  local_b3 = 1;
  this_04 = (NameExpression *)operator_new(0x28);
  local_b2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"malloc",&local_b1);
  IRT::Label::Label(&local_90,&local_b0);
  IRT::NameExpression::NameExpression(this_04,&local_90);
  local_b2 = 0;
  IRT::CallExpression::CallExpression(this_03,(Expression *)this_04,this);
  local_b3 = 0;
  IRT::MoveStatement::MoveStatement(this_02,(Expression *)pTVar1,(Expression *)this_03);
  local_b4 = 0;
  pTVar1 = (TempExpression *)operator_new(0x28);
  IRT::Temporary::Temporary(&local_d8,(Temporary *)local_48);
  IRT::TempExpression::TempExpression(pTVar1,&local_d8);
  IRT::EseqExpression::EseqExpression(this_01,(Statement *)this_02,(Expression *)pTVar1);
  IRT::Temporary::~Temporary(&local_d8);
  IRT::Label::~Label(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  IRT::Temporary::~Temporary(&local_68);
  IRT::Temporary::~Temporary((Temporary *)local_48);
  return &this_01->super_Expression;
}

Assistant:

IRT::Expression* CreateObject(PrimitiveSimpleObject* object) {
  auto* irt_expressions = new IRT::ExpressionList();
  irt_expressions->Add(new IRT::ConstExpression(object->GetSize()));

  IRT::Temporary tmp;
  return new IRT::EseqExpression(
      new IRT::MoveStatement(
          new IRT::TempExpression(tmp),
          new IRT::CallExpression(new IRT::NameExpression(IRT::Label("malloc")),
                                  irt_expressions)),
      new IRT::TempExpression(tmp));
}